

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::DynamicState::anon_unknown_0::DepthBiasParamTestInstance::iterate
          (TestStatus *__return_storage_ptr__,DepthBiasParamTestInstance *this)

{
  Context *this_00;
  TestLog *pTVar1;
  DeviceInterface *pDVar2;
  Image *this_01;
  TestStatus *pTVar3;
  bool bVar4;
  VkResult result;
  VkQueue pVVar5;
  Allocator *allocator;
  deUint32 in_ECX;
  deUint32 height;
  deUint32 stencilFrontWriteMask;
  int y;
  deUint32 dVar6;
  deUint32 in_R8D;
  deUint32 in_R9D;
  int x;
  float minDepthBounds;
  float fVar8;
  float in_XMM1_Da;
  deUint32 in_stack_fffffffffffffe98;
  long *local_158;
  long local_150;
  long local_148 [2];
  undefined8 local_138;
  undefined4 local_130;
  TestStatus *local_128;
  TestLog *local_120;
  VkQueue local_118;
  double local_110;
  double local_108;
  ConstPixelBufferAccess renderedFrame;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  Texture2D referenceFrame;
  VkSubmitInfo submitInfo;
  DepthBiasParamTestInstance *pDVar7;
  
  this_00 = (this->super_DepthBiasBaseCase).super_TestInstance.m_context;
  pTVar1 = this_00->m_testCtx->m_log;
  pDVar7 = this;
  pVVar5 = Context::getUniversalQueue(this_00);
  dVar6 = (deUint32)pDVar7;
  DepthBiasBaseCase::beginRenderPass(&this->super_DepthBiasBaseCase);
  DepthBiasBaseCase::setDynamicViewportState(&this->super_DepthBiasBaseCase,dVar6,height);
  referenceFrame.super_TextureLevelPyramid.m_format.order = R;
  referenceFrame.super_TextureLevelPyramid.m_format.type = SNORM_INT8;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dVar6 = (deUint32)
          (this->super_DepthBiasBaseCase).m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
          object;
  (*((this->super_DepthBiasBaseCase).m_vk)->_vptr_DeviceInterface[0x51])();
  DepthBiasBaseCase::setDynamicDepthStencilState
            (&this->super_DepthBiasBaseCase,minDepthBounds,in_XMM1_Da,dVar6,stencilFrontWriteMask,
             in_ECX,in_R8D,in_R9D,in_stack_fffffffffffffe98);
  pDVar2 = (this->super_DepthBiasBaseCase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x4c])
            (pDVar2,(this->super_DepthBiasBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DepthBiasBaseCase).m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  pDVar2 = (this->super_DepthBiasBaseCase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x58])
            (pDVar2,(this->super_DepthBiasBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  pDVar2 = (this->super_DepthBiasBaseCase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x4f])
            (0x3f800000,pDVar2,
             (this->super_DepthBiasBaseCase).m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.
             m_data.object);
  pDVar2 = (this->super_DepthBiasBaseCase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x50])
            (0,0,0,pDVar2,
             (this->super_DepthBiasBaseCase).m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.
             m_data.object);
  pDVar2 = (this->super_DepthBiasBaseCase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x59])
            (pDVar2,(this->super_DepthBiasBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,4,1,0,0);
  pDVar2 = (this->super_DepthBiasBaseCase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x59])
            (pDVar2,(this->super_DepthBiasBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,4,1,4,0);
  pDVar2 = (this->super_DepthBiasBaseCase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x4f])
            (0x3f800000,pDVar2,
             (this->super_DepthBiasBaseCase).m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.
             m_data.object);
  pDVar2 = (this->super_DepthBiasBaseCase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x50])
            (0xbf800000,0,0,pDVar2,
             (this->super_DepthBiasBaseCase).m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.
             m_data.object);
  pDVar2 = (this->super_DepthBiasBaseCase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x59])
            (pDVar2,(this->super_DepthBiasBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,4,1,8,0);
  pDVar2 = (this->super_DepthBiasBaseCase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x76])
            (pDVar2,(this->super_DepthBiasBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar2 = (this->super_DepthBiasBaseCase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x4a])
            (pDVar2,(this->super_DepthBiasBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar2 = (this->super_DepthBiasBaseCase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[2])(pDVar2,pVVar5,1);
  pDVar2 = (this->super_DepthBiasBaseCase).m_vk;
  result = (*pDVar2->_vptr_DeviceInterface[3])(pDVar2,pVVar5);
  ::vk::checkResult(result,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/dynamic_state/vktDynamicStateRSTests.cpp"
                    ,0x1bc);
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_DepthBiasBaseCase).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D(&referenceFrame,&renderedFrame.m_format,0x80,0x80);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0x3f800000;
  local_128 = __return_storage_ptr__;
  local_120 = pTVar1;
  local_118 = pVVar5;
  tcu::clear(referenceFrame.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame);
  if (0 < referenceFrame.m_height) {
    local_110 = (double)referenceFrame.m_height * 0.5;
    local_108 = (double)referenceFrame.m_width * 0.5;
    y = 0;
    do {
      if (0 < referenceFrame.m_width) {
        fVar8 = (float)((double)y / local_110) + -1.0;
        x = 0;
        do {
          if (((0.5 < fVar8) || (fVar8 < -0.5)) ||
             (0.5 < ABS((float)((double)x / local_108) + -1.0))) {
            renderedFrame.m_format.order = R;
            renderedFrame.m_format.type = SNORM_INT8;
            renderedFrame.m_size.m_data[0] = 0x3f800000;
            renderedFrame.m_size.m_data[1] = 0x3f800000;
            tcu::PixelBufferAccess::setPixel
                      (referenceFrame.super_TextureLevelPyramid.m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x,y,0);
          }
          else {
            renderedFrame.m_format.order = R;
            renderedFrame.m_format.type = 0x3f800000;
            renderedFrame.m_size.m_data[0] = 0;
            renderedFrame.m_size.m_data[1] = 0x3f800000;
            tcu::PixelBufferAccess::setPixel
                      (referenceFrame.super_TextureLevelPyramid.m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x,y,0);
          }
          x = x + 1;
        } while (referenceFrame.m_width != x);
      }
      y = y + 1;
    } while (y != referenceFrame.m_height);
  }
  this_01 = (this->super_DepthBiasBaseCase).m_colorTargetImage.m_ptr;
  allocator = Context::getDefaultAllocator
                        ((this->super_DepthBiasBaseCase).super_TestInstance.m_context);
  local_130 = 0;
  local_138 = 0;
  Draw::Image::readSurface
            (&renderedFrame,this_01,local_118,allocator,VK_IMAGE_LAYOUT_GENERAL,
             (VkOffset3D)(ZEXT412(0) << 0x40),0x80,0x80,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  bVar4 = tcu::fuzzyCompare(local_120,"Result","Image comparison result",
                            &(referenceFrame.super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess,&renderedFrame,0.05,COMPARE_LOG_RESULT);
  pTVar3 = local_128;
  local_158 = local_148;
  if (bVar4) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Image verification passed","");
    pTVar3->m_code = QP_TEST_RESULT_PASS;
    (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar3->m_description,local_158,local_150 + (long)local_158);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Image verification failed","");
    pTVar3->m_code = QP_TEST_RESULT_FAIL;
    (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar3->m_description,local_158,local_150 + (long)local_158);
  }
  if (local_158 != local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return pTVar3;
}

Assistant:

virtual tcu::TestStatus iterate (void)
	{
		tcu::TestLog &log		= m_context.getTestContext().getLog();
		const vk::VkQueue queue = m_context.getUniversalQueue();

		beginRenderPass();

		// set states here
		setDynamicViewportState(WIDTH, HEIGHT);
		setDynamicBlendState();
		setDynamicDepthStencilState();

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

		const vk::VkDeviceSize vertexBufferOffset	= 0;
		const vk::VkBuffer vertexBuffer				= m_vertexBuffer->object();
		m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

		setDynamicRasterizationState(1.0f, 0.0f);
		m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 0, 0);
		m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 4, 0);

		setDynamicRasterizationState(1.0f, -1.0f);
		m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 8, 0);

		m_vk.cmdEndRenderPass(*m_cmdBuffer);
		m_vk.endCommandBuffer(*m_cmdBuffer);

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// validation
		{
			VK_CHECK(m_vk.queueWaitIdle(queue));

			tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
			referenceFrame.allocLevel(0);

			const deInt32 frameWidth = referenceFrame.getWidth();
			const deInt32 frameHeight = referenceFrame.getHeight();

			tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

			for (int y = 0; y < frameHeight; y++)
			{
				const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

				for (int x = 0; x < frameWidth; x++)
				{
					const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

					if (xCoord >= -0.5f && xCoord <= 0.5f && yCoord >= -0.5f && yCoord <= 0.5f)
						referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f), x, y);
					else
						referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
				}
			}

			const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
			const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
				vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

			if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
				referenceFrame.getLevel(0), renderedFrame, 0.05f,
				tcu::COMPARE_LOG_RESULT))
			{
				return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Image verification failed");
			}

			return tcu::TestStatus(QP_TEST_RESULT_PASS, "Image verification passed");
		}
	}